

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O0

void __thiscall
polyscope::render::backend_openGL_mock::GLTextureBuffer::resize(GLTextureBuffer *this,uint newLen)

{
  runtime_error *this_00;
  socklen_t in_ECX;
  sockaddr *__addr;
  uint in_ESI;
  TextureBuffer *in_RDI;
  
  TextureBuffer::resize(in_RDI,in_ESI);
  bind((GLTextureBuffer *)in_RDI,in_ESI,__addr,in_ECX);
  if (in_RDI->dim == 2) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"OpenGL error: called 1D resize on 2D texture");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  checkGLError(true);
  return;
}

Assistant:

void GLTextureBuffer::resize(unsigned int newLen) {

  TextureBuffer::resize(newLen);

  bind();
  if (dim == 1) {
  }
  if (dim == 2) {
    throw std::runtime_error("OpenGL error: called 1D resize on 2D texture");
  }
  checkGLError();
}